

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# low_level_alloc.cc
# Opt level: O2

Arena * tcmalloc::LowLevelAlloc::NewArenaWithCustomAlloc(PagesAllocator *allocator)

{
  int iVar1;
  undefined4 extraout_var;
  Arena *this;
  long extraout_RDX;
  
  if (allocator == (PagesAllocator *)0x0) {
    this = (Arena *)AllocWithArena(0x140,(Arena *)0x0);
    Arena::Arena(this);
  }
  else {
    iVar1 = (*allocator->_vptr_PagesAllocator[2])(allocator,0x100000);
    this = (Arena *)CONCAT44(extraout_var,iVar1);
    Arena::Arena(this);
    this->allocator = allocator;
    SpinLock::Lock((SpinLock *)this);
    Arena::InsertAllocatedMemoryLocked(this,this + 1,extraout_RDX - 0x140);
    SpinLock::Unlock((SpinLock *)this);
  }
  return this;
}

Assistant:

LowLevelAlloc::Arena *LowLevelAlloc::NewArenaWithCustomAlloc(PagesAllocator *allocator) {
  if (allocator) {
    void* memory;
    size_t got_amount;
    std::tie(memory, got_amount) = allocator->MapPages(kMinimalRegion);

    Arena *result = new (memory) Arena();
    result->allocator = allocator;
    result->mu.Lock();
    result->InsertAllocatedMemoryLocked(result + 1, got_amount - sizeof(Arena));
    result->mu.Unlock();
    return result;
  }

  return new (AllocWithArena(sizeof(Arena), nullptr)) Arena();
}